

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCall
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this,string *id)

{
  bool bVar1;
  __type _Var2;
  pointer this_00;
  reference __lhs;
  string *psVar3;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *this_01;
  cmAlphaNum local_118;
  cmAlphaNum local_e8;
  string local_b8;
  reference local_98;
  cmListFileArgument *arg;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range4;
  DeferCommand *dc;
  iterator __end2;
  iterator __begin2;
  vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_> *__range2;
  string tmp;
  string *id_local;
  cmMakefile *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *call;
  
  tmp.field_2._M_local_buf[0xf] = '\0';
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(__return_storage_ptr__);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Defer);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&__range2);
  this_00 = std::
            unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
            operator->(&this->Defer);
  __end2 = std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::begin
                     (&this_00->Commands);
  dc = (DeferCommand *)
       std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::end
                 (&this_00->Commands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>
                                *)&dc);
    if (!bVar1) goto LAB_00425a54;
    __lhs = __gnu_cxx::
            __normal_iterator<cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>
            ::operator*(&__end2);
    _Var2 = std::operator==(&__lhs->Id,id);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>
    ::operator++(&__end2);
  }
  psVar3 = cmListFileFunction::OriginalName_abi_cxx11_(&__lhs->Command);
  std::__cxx11::string::operator=((string *)&__range2,(string *)psVar3);
  this_01 = cmListFileFunction::Arguments(&__lhs->Command);
  __end4 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(this_01);
  arg = (cmListFileArgument *)
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end4,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                     *)&arg), bVar1) {
    local_98 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator*(&__end4);
    cmAlphaNum::cmAlphaNum(&local_e8,(string *)&__range2);
    cmAlphaNum::cmAlphaNum(&local_118,';');
    cmStrCat<std::__cxx11::string>(&local_b8,&local_e8,&local_118,&local_98->Value);
    std::__cxx11::string::operator=((string *)&__range2,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&__end4);
  }
LAB_00425a54:
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
  std::__cxx11::string::~string((string *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCall(std::string const& id) const
{
  cm::optional<std::string> call;
  if (this->Defer) {
    std::string tmp;
    for (DeferCommand const& dc : this->Defer->Commands) {
      if (dc.Id == id) {
        tmp = dc.Command.OriginalName();
        for (cmListFileArgument const& arg : dc.Command.Arguments()) {
          tmp = cmStrCat(tmp, ';', arg.Value);
        }
        break;
      }
    }
    call = std::move(tmp);
  }
  return call;
}